

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>
fmt::v8::detail::
write_ptr<char8_t,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,unsigned_long>
          (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> out,unsigned_long value,
          basic_format_specs<char8_t> *specs)

{
  size_t sVar1;
  ulong uVar2;
  char *pcVar3;
  unsigned_long uVar4;
  char8_t *pcVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  anon_class_16_2_92d121e5 write;
  anon_class_16_2_92d121e5 local_48;
  char local_38 [32];
  
  uVar4 = value;
  lVar9 = 0;
  do {
    lVar8 = lVar9;
    lVar9 = lVar8 + 1;
    bVar10 = 0xf < uVar4;
    uVar4 = uVar4 >> 4;
  } while (bVar10);
  local_48.num_digits = (int)lVar9;
  local_48.value = value;
  if (specs == (basic_format_specs<char8_t> *)0x0) {
    sVar1 = (out.container)->size_;
    uVar6 = (out.container)->capacity_;
    uVar7 = sVar1 + 1;
    if (uVar6 < uVar7) {
      (**(out.container)->_vptr_buffer)(out.container);
      sVar1 = (out.container)->size_;
      uVar6 = (out.container)->capacity_;
      uVar7 = sVar1 + 1;
    }
    pcVar5 = (out.container)->ptr_;
    (out.container)->size_ = uVar7;
    pcVar5[sVar1] = '0';
    uVar2 = uVar7 + 1;
    if (uVar6 < uVar2) {
      (**(out.container)->_vptr_buffer)(out.container,uVar2);
      pcVar5 = (out.container)->ptr_;
      uVar7 = (out.container)->size_;
      uVar2 = uVar7 + 1;
    }
    (out.container)->size_ = uVar2;
    pcVar5[uVar7] = 'x';
    if ((out.container)->capacity_ < uVar2 + lVar9) {
      pcVar3 = local_38 + lVar8;
      do {
        *pcVar3 = "0123456789abcdef"[(uint)value & 0xf];
        pcVar3 = pcVar3 + -1;
        bVar10 = 0xf < value;
        value = value >> 4;
      } while (bVar10);
      out = copy_str_noinline<char8_t,char*,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>>
                      (local_38,local_38 + lVar8 + 1,out);
    }
    else {
      (out.container)->size_ = uVar2 + lVar9;
      pcVar3 = pcVar5 + lVar9 + uVar2;
      do {
        pcVar3 = pcVar3 + -1;
        *pcVar3 = "0123456789abcdef"[(uint)value & 0xf];
        bVar10 = 0xf < value;
        value = value >> 4;
      } while (bVar10);
    }
  }
  else {
    out = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t,fmt::v8::detail::write_ptr<char8_t,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,unsigned_long>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,unsigned_long,fmt::v8::basic_format_specs<char8_t>const*)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_1_&>
                    (out,specs,lVar8 + 3U,lVar8 + 3U,&local_48);
  }
  return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)out.container;
}

Assistant:

auto write_ptr(OutputIt out, UIntPtr value,
               const basic_format_specs<Char>* specs) -> OutputIt {
  int num_digits = count_digits<4>(value);
  auto size = to_unsigned(num_digits) + size_t(2);
  auto write = [=](reserve_iterator<OutputIt> it) {
    *it++ = static_cast<Char>('0');
    *it++ = static_cast<Char>('x');
    return format_uint<4, Char>(it, value, num_digits);
  };
  return specs ? write_padded<align::right>(out, *specs, size, write)
               : base_iterator(out, write(reserve(out, size)));
}